

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderFragDataTests.cpp
# Opt level: O0

bool deqp::gles3::Functional::anon_unknown_0::compareSingleColor
               (TestLog *log,Surface *surface,RGBA expectedColor,RGBA threshold)

{
  bool bVar1;
  RGBA RVar2;
  Surface *this;
  int iVar3;
  int iVar4;
  MessageBuilder *pMVar5;
  MessageBuilder local_8b8;
  allocator<char> local_731;
  string local_730;
  allocator<char> local_709;
  string local_708;
  LogImage local_6e8;
  MessageBuilder local_658;
  MessageBuilder local_4d8;
  MessageBuilder local_358;
  deUint32 local_1d8;
  deUint32 local_1d4;
  deUint32 local_1d0;
  undefined1 local_1c9;
  RGBA local_1c8;
  int iStack_1c4;
  bool isOk;
  RGBA resultColor;
  int x;
  int y;
  MessageBuilder local_1b0;
  int local_30 [2];
  int numFailedPixels;
  int maxPrints;
  Surface *surface_local;
  TestLog *log_local;
  RGBA local_10;
  RGBA threshold_local;
  RGBA expectedColor_local;
  
  local_30[1] = 10;
  local_30[0] = 0;
  _numFailedPixels = surface;
  surface_local = (Surface *)log;
  log_local._4_4_ = threshold.m_value;
  local_10.m_value = expectedColor.m_value;
  tcu::TestLog::operator<<(&local_1b0,log,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar5 = tcu::MessageBuilder::operator<<(&local_1b0,(char (*) [11])"Expecting ");
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_10);
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [17])" with threshold ");
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(RGBA *)((long)&log_local + 4));
  tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1b0);
  for (resultColor.m_value = 0; RVar2.m_value = resultColor.m_value,
      iVar3 = tcu::Surface::getHeight(_numFailedPixels), (int)RVar2.m_value < iVar3;
      resultColor.m_value = resultColor.m_value + 1) {
    for (iStack_1c4 = 0; iVar3 = iStack_1c4, iVar4 = tcu::Surface::getWidth(_numFailedPixels),
        iVar3 < iVar4; iStack_1c4 = iStack_1c4 + 1) {
      local_1d0 = (deUint32)tcu::Surface::getPixel(_numFailedPixels,iStack_1c4,resultColor.m_value);
      local_1d4 = local_10.m_value;
      local_1d8 = log_local._4_4_;
      local_1c8 = (RGBA)local_1d0;
      local_1c9 = tcu::compareThreshold((RGBA)local_1d0,local_10,log_local._4_4_);
      if (!(bool)local_1c9) {
        if (local_30[0] < 10) {
          tcu::TestLog::operator<<
                    (&local_358,(TestLog *)surface_local,(BeginMessageToken *)&tcu::TestLog::Message
                    );
          pMVar5 = tcu::MessageBuilder::operator<<(&local_358,(char (*) [12])"ERROR: Got ");
          pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_1c8);
          pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [6])0x130d130);
          pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&stack0xfffffffffffffe3c);
          pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [3])0x12ed2ef);
          pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(int *)&resultColor);
          pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [3])")!");
          tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_358);
        }
        else if (local_30[0] == 10) {
          tcu::TestLog::operator<<
                    (&local_4d8,(TestLog *)surface_local,(BeginMessageToken *)&tcu::TestLog::Message
                    );
          pMVar5 = tcu::MessageBuilder::operator<<(&local_4d8,(char (*) [4])0x128bd65);
          tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_4d8);
        }
        local_30[0] = local_30[0] + 1;
      }
    }
  }
  bVar1 = local_30[0] < 1;
  if (bVar1) {
    tcu::TestLog::operator<<
              (&local_8b8,(TestLog *)surface_local,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar5 = tcu::MessageBuilder::operator<<(&local_8b8,(char (*) [25])"Image comparison passed.");
    tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_8b8);
  }
  else {
    tcu::TestLog::operator<<
              (&local_658,(TestLog *)surface_local,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar5 = tcu::MessageBuilder::operator<<(&local_658,(char (*) [7])"Found ");
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,local_30);
    pMVar5 = tcu::MessageBuilder::operator<<
                       (pMVar5,(char (*) [36])" invalid pixels, comparison FAILED!");
    tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_658);
    this = surface_local;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_708,"ResultImage",&local_709);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_730,"Result Image",&local_731);
    tcu::LogImage::LogImage
              (&local_6e8,&local_708,&local_730,_numFailedPixels,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::TestLog::operator<<((TestLog *)this,&local_6e8);
    tcu::LogImage::~LogImage(&local_6e8);
    std::__cxx11::string::~string((string *)&local_730);
    std::allocator<char>::~allocator(&local_731);
    std::__cxx11::string::~string((string *)&local_708);
    std::allocator<char>::~allocator(&local_709);
  }
  return bVar1;
}

Assistant:

static bool compareSingleColor (tcu::TestLog& log, const tcu::Surface& surface, tcu::RGBA expectedColor, tcu::RGBA threshold)
{
	const int	maxPrints			= 10;
	int			numFailedPixels		= 0;

	log << TestLog::Message << "Expecting " << expectedColor << " with threshold " << threshold << TestLog::EndMessage;

	for (int y = 0; y < surface.getHeight(); y++)
	{
		for (int x = 0; x < surface.getWidth(); x++)
		{
			const tcu::RGBA		resultColor		= surface.getPixel(x, y);
			const bool			isOk			= compareThreshold(resultColor, expectedColor, threshold);

			if (!isOk)
			{
				if (numFailedPixels < maxPrints)
					log << TestLog::Message << "ERROR: Got " << resultColor << " at (" << x << ", " << y << ")!" << TestLog::EndMessage;
				else if (numFailedPixels == maxPrints)
					log << TestLog::Message << "..." << TestLog::EndMessage;

				numFailedPixels += 1;
			}
		}
	}

	if (numFailedPixels > 0)
	{
		log << TestLog::Message << "Found " << numFailedPixels << " invalid pixels, comparison FAILED!" << TestLog::EndMessage;
		log << TestLog::Image("ResultImage", "Result Image", surface);
		return false;
	}
	else
	{
		log << TestLog::Message << "Image comparison passed." << TestLog::EndMessage;
		return true;
	}
}